

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::Player(Player *this,int min,int max)

{
  DynastyDeck *pDVar1;
  GreenCard *card;
  BlackCard *pBVar2;
  int iVar3;
  int iVar4;
  Stronghold *pSVar5;
  DeckBuilder *pDVar6;
  _List_node_base *black;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  list<BlackCard_*,_std::allocator<BlackCard_*>_> *plVar9;
  Player *pPVar10;
  long lVar11;
  bool bVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  _List_node_base *local_178;
  allocator_type local_169;
  allocator local_168;
  allocator local_167;
  allocator local_166;
  allocator local_165;
  allocator local_164;
  allocator local_163;
  allocator local_162;
  allocator local_161;
  DeckBuilder *local_160;
  Player *local_158;
  DynastyDeck *local_150;
  FateDeck *local_148;
  DynastyDeck *local_140;
  Deck *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  this->stronghold = (Stronghold *)0x0;
  local_148 = &this->fateDeck;
  FateDeck::FateDeck(local_148);
  local_150 = &this->dynDeck;
  DynastyDeck::DynastyDeck(local_150);
  pDVar1 = &this->provinces;
  DynastyDeck::DynastyDeck(pDVar1);
  local_138 = &this->hand;
  Deck::Deck(local_138);
  DynastyDeck::DynastyDeck(&this->holdings);
  DynastyDeck::DynastyDeck(&this->army);
  local_158 = this;
  std::__cxx11::string::string((string *)&local_130,"Golden Plains Outpost",&local_161);
  std::__cxx11::string::string(local_110,"High House of Light",&local_162);
  std::__cxx11::string::string(local_f0,"Closed Shell Castle",&local_163);
  std::__cxx11::string::string(local_d0,"Mountain\'s Anvil Castle",&local_164);
  std::__cxx11::string::string(local_b0,"Seven Strings Keep",&local_165);
  std::__cxx11::string::string(local_90,"City of the Open Hand",&local_166);
  std::__cxx11::string::string(local_70,"Shiro City",&local_167);
  std::__cxx11::string::string(local_50,"Red Fort",&local_168);
  __l._M_len = 8;
  __l._M_array = &local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_158->names,__l,&local_169);
  lVar11 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_130._M_dataplus._M_p + lVar11));
    pPVar10 = local_158;
    lVar11 = lVar11 + -0x20;
  } while (lVar11 != -0x20);
  pSVar5 = GenerateRandomStronghold(local_158);
  pPVar10->stronghold = pSVar5;
  iVar3 = (*(pSVar5->super_BlackCard).super_Card._vptr_Card[6])(pSVar5);
  pPVar10->honour = iVar3;
  pPVar10->minCards = min;
  pPVar10->maxCards = max;
  pPVar10->numberOfProvinces = 4;
  pPVar10->maxHand = 6;
  pDVar6 = (DeckBuilder *)operator_new(0x10);
  DeckBuilder::DeckBuilder(pDVar6);
  local_178 = (_List_node_base *)DeckBuilder::createFateDeck_abi_cxx11_(pDVar6);
  DeckBuilder::deckShuffler(pDVar6,(list<GreenCard_*,_std::allocator<GreenCard_*>_> *)local_178);
  black = (_List_node_base *)DeckBuilder::createDynastyDeck_abi_cxx11_(pDVar6);
  local_160 = pDVar6;
  DeckBuilder::deckShuffler(pDVar6,(list<BlackCard_*,_std::allocator<BlackCard_*>_> *)black);
  iVar3 = 0;
  p_Var7 = local_178;
  while( true ) {
    p_Var7 = (((_List_base<GreenCard_*,_std::allocator<GreenCard_*>_> *)&p_Var7->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    iVar4 = pPVar10->maxCards;
    if ((p_Var7 == local_178) || (iVar3 == iVar4)) break;
    FateDeck::pushCard(local_148,(GreenCard *)p_Var7[1]._M_next);
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::remove
              ((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)local_178,(char *)(p_Var7 + 1));
    iVar3 = iVar3 + 1;
    p_Var7 = local_178->_M_next;
  }
  p_Var8 = black;
  local_140 = pDVar1;
  if (iVar3 < pPVar10->minCards) {
    local_178 = (_List_node_base *)DeckBuilder::createFateDeck_abi_cxx11_(local_160);
    DeckBuilder::deckShuffler
              (local_160,(list<GreenCard_*,_std::allocator<GreenCard_*>_> *)local_178);
    p_Var7 = local_178;
    while( true ) {
      p_Var7 = p_Var7->_M_next;
      iVar4 = pPVar10->maxCards;
      if ((p_Var7 == local_178) || (iVar3 == iVar4)) break;
      card = (GreenCard *)p_Var7[1]._M_next;
      FateDeck::pushCard(local_148,card);
      std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::remove
                ((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)local_178,(char *)(p_Var7 + 1));
      if (card != (GreenCard *)0x0) {
        (*(card->super_Card)._vptr_Card[3])(card);
      }
      p_Var7 = local_178->_M_next;
      iVar3 = iVar3 + 1;
    }
  }
  for (; (pDVar1 = local_140,
         p_Var8 = (((_List_base<BlackCard_*,_std::allocator<BlackCard_*>_> *)&p_Var8->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next, p_Var8 != black &&
         (iVar3 != iVar4)); iVar3 = iVar3 + 1) {
    pBVar2 = (BlackCard *)p_Var8[1]._M_next;
    DynastyDeck::pushCard(local_150,pBVar2);
    std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::remove
              ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)black,(char *)(p_Var8 + 1));
    if (pBVar2 != (BlackCard *)0x0) {
      (*(pBVar2->super_Card)._vptr_Card[3])(pBVar2);
    }
    iVar4 = pPVar10->maxCards;
    p_Var8 = black->_M_next;
  }
  pDVar6 = local_160;
  if (iVar3 < pPVar10->minCards) {
    black = (_List_node_base *)DeckBuilder::createDynastyDeck_abi_cxx11_(local_160);
    DeckBuilder::deckShuffler(local_160,(list<BlackCard_*,_std::allocator<BlackCard_*>_> *)black);
    p_Var8 = black;
    for (; (p_Var8 = p_Var8->_M_next, pDVar6 = local_160, p_Var8 != black &&
           (iVar3 != pPVar10->maxCards)); iVar3 = iVar3 + 1) {
      pBVar2 = (BlackCard *)p_Var8[1]._M_next;
      DynastyDeck::pushCard(local_150,pBVar2);
      std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::remove
                ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)black,(char *)(p_Var8 + 1));
      if (pBVar2 != (BlackCard *)0x0) {
        (*(pBVar2->super_Card)._vptr_Card[3])(pBVar2);
      }
      p_Var8 = black->_M_next;
      pPVar10 = local_158;
    }
  }
  while (plVar9 = DynastyDeck::getDynDeck_abi_cxx11_(pDVar1),
        (plVar9->super__List_base<BlackCard_*,_std::allocator<BlackCard_*>_>)._M_impl._M_node.
        _M_size < 5) {
    DeckBuilder::deckShuffler(pDVar6,(list<BlackCard_*,_std::allocator<BlackCard_*>_> *)black);
    if (black->_M_next == black) {
      black = (_List_node_base *)DeckBuilder::createDynastyDeck_abi_cxx11_(pDVar6);
      DeckBuilder::deckShuffler(pDVar6,(list<BlackCard_*,_std::allocator<BlackCard_*>_> *)black);
      p_Var8 = black->_M_next;
    }
    DynastyDeck::pushCard(pDVar1,(BlackCard *)p_Var8[1]._M_next);
    std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::remove
              ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)black,(char *)(p_Var8 + 1));
    p_Var8 = black->_M_next;
  }
  iVar3 = 3;
  while (bVar12 = iVar3 != 0, iVar3 = iVar3 + -1, bVar12) {
    DeckBuilder::deckShuffler(pDVar6,(list<GreenCard_*,_std::allocator<GreenCard_*>_> *)local_178);
    if (local_178->_M_next == local_178) {
      local_178 = (_List_node_base *)DeckBuilder::createFateDeck_abi_cxx11_(pDVar6);
      DeckBuilder::deckShuffler(pDVar6,(list<GreenCard_*,_std::allocator<GreenCard_*>_> *)local_178)
      ;
      p_Var7 = local_178->_M_next;
    }
    Deck::pushCard(local_138,(Card *)p_Var7[1]._M_next);
    std::__cxx11::list<GreenCard_*,_std::allocator<GreenCard_*>_>::remove
              ((list<GreenCard_*,_std::allocator<GreenCard_*>_> *)local_178,(char *)(p_Var7 + 1));
    p_Var7 = local_178->_M_next;
  }
  DeckBuilder::~DeckBuilder(pDVar6);
  operator_delete(pDVar6,0x10);
  return;
}

Assistant:

Player::Player(int min, int max)
{
    stronghold = GenerateRandomStronghold();
    honour = stronghold->getHonour();

    minCards = min;
    maxCards = max;
    numberOfProvinces = 4;
    maxHand = 6;

    int count = 0;

    //creates general decks with all the cards and shuffles them
    DeckBuilder *build = new DeckBuilder();

    list<GreenCard*> *green = build->createFateDeck();
    list<GreenCard*>::iterator it = green->begin();
    build->deckShuffler(green);

    list<BlackCard*> *black = build->createDynastyDeck();
    list<BlackCard*>::iterator it1 = black->begin();
    build->deckShuffler(black);

    //creates fateDeck with num E[minCards, maxCards] cards from green
    for (it=green->begin(); it!=green->end(); it++)
    {
        if (count == maxCards)
            break;

        GreenCard *newCard = *it;
        fateDeck.pushCard(newCard);

        green->remove(*it);
        count++;

        newCard = nullptr;
        delete newCard;
        it=green->begin();
    }
    if (count < minCards)           //if deck too small creates a new green deck and adds more
    {
        green = build->createFateDeck();
        build->deckShuffler(green);

        for (it=green->begin(); it!=green->end(); it++)
        {
            if (count == maxCards)
                break;

            GreenCard *newCard = *it;
            fateDeck.pushCard(newCard);

            green->remove(*it);
            count++;

            delete newCard;
            it=green->begin();
        }
    }

    //creates dynDeck with num E[minCards, maxCards] cards from black
    for (it1=black->begin(); it1!=black->end(); it1++)
    {
        if (count == maxCards)
            break;

        BlackCard *newCard = *it1;
        dynDeck.pushCard(newCard);

        black->remove(*it1);
        count++;

        delete newCard;
        it1=black->begin();
    }

    if (count < minCards)           //if deck too small creates a new green deck and adds more
    {
        black = build->createDynastyDeck();
        build->deckShuffler(black);

        for (it1=black->begin(); it1!=black->end(); it1++)
        {
            if (count == maxCards)
                break;

            BlackCard *newCard = *it1;
            dynDeck.pushCard(newCard);

            black->remove(*it1);
            count++;

            delete newCard;
            it1=black->begin();
        }
    }

    //creates provinces with first 4 cards of black
    while (provinces.getDynDeck().size() < 5)//4 cards + list.end()
    {
        build->deckShuffler(black);
        if (black->empty())                                 //if it empties generate a new black deck and shuffle it
        {
            black = build->createDynastyDeck();
            build->deckShuffler(black);
            it1 = black->begin();
        }

        BlackCard *newCard = *it1;
        provinces.pushCard(newCard);

        black->remove(*it1);
        it1=black->begin();
    }

    //builds hand with first 3 cards of green deck
    int i;
    for (i=0; i<3; i++)                                     //players start with 3 cards in their hand
    {
        build->deckShuffler(green);
        if (green->empty())                                 //if it empties generate a new green deck and shuffle it
        {
            green = build->createFateDeck();
            build->deckShuffler(green);
            it = green->begin();
        }
        GreenCard *newCard = *it;
        hand.pushCard(newCard);

        green->remove(*it);
        it = green->begin();
    }

    delete build;
}